

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

int Gia_ManQuantCountUsed_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  int local_2c;
  int Count;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  local_2c = 1;
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      iVar1 = Gia_ManQuantCheckSupp(p,iVar1,p->iSuppPi);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
        local_2c = Gia_ManQuantCountUsed_rec(p,iVar1);
        local_2c = local_2c + 1;
      }
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      iVar1 = Gia_ManQuantCheckSupp(p,iVar1,p->iSuppPi);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
        iVar1 = Gia_ManQuantCountUsed_rec(p,iVar1);
        local_2c = iVar1 + local_2c;
      }
      p_local._4_4_ = local_2c;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManQuantCountUsed_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj; int Count = 1;
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return 0;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Gia_ManQuantCheckSupp(p, Gia_ObjFaninId0(pObj, iObj), p->iSuppPi) )
        Count += Gia_ManQuantCountUsed_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ManQuantCheckSupp(p, Gia_ObjFaninId1(pObj, iObj), p->iSuppPi) )
        Count += Gia_ManQuantCountUsed_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    return Count;
}